

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
          (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this,
          size_t initialCapacity)

{
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  size_t sVar2;
  
  this->_capacity = initialCapacity;
  if (initialCapacity == 0) {
    sVar2 = 0;
    pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  }
  else {
    pMVar1 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             Lib::alloc(initialCapacity * 0x1c);
    sVar2 = this->_capacity;
  }
  this->_stack = pMVar1;
  this->_cursor = pMVar1;
  this->_end = pMVar1 + sVar2;
  return;
}

Assistant:

inline
  explicit Stack (size_t initialCapacity=0)
    : _capacity(initialCapacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = nullptr;
    }
    _cursor = _stack;
    _end = _stack+_capacity;
  }